

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QFileSystemEntry * QFileSystemEngine::currentPath(void)

{
  long lVar1;
  char *pcVar2;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_1078;
  QFileSystemEntry local_1060;
  char currentName [4097];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->m_lastSeparator = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_nativeFilePath).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_nativeFilePath).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_filePath).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_nativeFilePath).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_filePath).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_filePath).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry(in_RDI);
  memset(currentName,0xaa,0x1001);
  pcVar2 = getcwd(currentName,0x1000);
  if (pcVar2 != (char *)0x0) {
    QByteArray::QByteArray((QByteArray *)&QStack_1078,currentName,-1);
    QFileSystemEntry::QFileSystemEntry(&local_1060,&QStack_1078);
    QFileSystemEntry::operator=(in_RDI,&local_1060);
    QFileSystemEntry::~QFileSystemEntry(&local_1060);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_1078);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::currentPath()
{
    QFileSystemEntry result;
#if defined(__GLIBC__) && !defined(PATH_MAX)
    char *currentName = ::get_current_dir_name();
    if (currentName) {
        result = QFileSystemEntry(QByteArray(currentName), QFileSystemEntry::FromNativePath());
        ::free(currentName);
    }
#else
    char currentName[PATH_MAX+1];
    if (::getcwd(currentName, PATH_MAX)) {
#if defined(Q_OS_VXWORKS) && defined(VXWORKS_VXSIM)
        QByteArray dir(currentName);
        if (dir.indexOf(':') < dir.indexOf('/'))
            dir.remove(0, dir.indexOf(':')+1);

        qstrncpy(currentName, dir.constData(), PATH_MAX);
#endif
        result = QFileSystemEntry(QByteArray(currentName), QFileSystemEntry::FromNativePath());
    }
# if defined(QT_DEBUG)
    if (result.isEmpty())
        qWarning("QFileSystemEngine::currentPath: getcwd() failed");
# endif
#endif
    return result;
}